

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.h
# Opt level: O2

double __thiscall
BayesianGameForDecPOMDPStage::GetImmediateReward
          (BayesianGameForDecPOMDPStage *this,Index jtI,Index jaI,
          FactoredDecPOMDPDiscreteInterface *fd)

{
  const_reference this_00;
  const_reference pvVar1;
  double dVar2;
  
  if (this->_m_areCachedImmediateRewards == true) {
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::at(&this->_m_immR,(ulong)jtI);
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(this_00,(ulong)jaI);
    return *pvVar1;
  }
  dVar2 = ComputeImmediateReward(this,jtI,jaI);
  return dVar2;
}

Assistant:

double GetImmediateReward(Index jtI, Index jaI,
                                  const FactoredDecPOMDPDiscreteInterface* fd=0) const
        {
            if(_m_areCachedImmediateRewards)
                return _m_immR.at(jtI).at(jaI);
            else
                return ComputeImmediateReward(jtI, jaI);
        }